

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O0

string * __thiscall
Assimp::CFIReaderImpl::parseIdentifyingStringOrIndex
          (CFIReaderImpl *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *stringTable)

{
  DeadlyImportError *pDVar1;
  size_t sVar2;
  size_type sVar3;
  string local_58;
  size_type local_38;
  size_t index;
  uint8_t b;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *stringTable_local;
  CFIReaderImpl *this_local;
  
  local_20 = stringTable;
  stringTable_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)this;
  if ((long)this->dataEnd - (long)this->dataP < 1) {
    pDVar1 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    DeadlyImportError::DeadlyImportError(pDVar1,(string *)parseErrorMessage_abi_cxx11_);
    __cxa_throw(pDVar1,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  index._3_1_ = *this->dataP;
  if ((index._3_1_ & 0x80) == 0) {
    parseNonEmptyOctetString2_abi_cxx11_(&local_58,this);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(stringTable,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    this_local = (CFIReaderImpl *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::back(local_20);
  }
  else {
    sVar2 = parseInt2(this);
    local_38 = sVar2;
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(local_20);
    if (sVar3 <= sVar2) {
      pDVar1 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      DeadlyImportError::DeadlyImportError(pDVar1,(string *)parseErrorMessage_abi_cxx11_);
      __cxa_throw(pDVar1,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
    }
    this_local = (CFIReaderImpl *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](local_20,local_38);
  }
  return (string *)this_local;
}

Assistant:

const std::string &parseIdentifyingStringOrIndex(std::vector<std::string> &stringTable) { // C.13
        if (dataEnd - dataP < 1) {
            throw DeadlyImportError(parseErrorMessage);
        }
        uint8_t b = *dataP;
        if (b & 0x80) {
            // We have an index (C.13.4)
            size_t index = parseInt2();
            if (index >= stringTable.size()) {
                throw DeadlyImportError(parseErrorMessage);
            }
            return stringTable[index];
        }
        else {
            // We have a string (C.13.3)
            stringTable.push_back(parseNonEmptyOctetString2());
            return stringTable.back();
        }
    }